

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_descriptor.h
# Opt level: O0

FormatDescriptor * ktx::createFormatDescriptor(VkFormat vkFormat,Reporter *report)

{
  bool bVar1;
  unique_ptr<unsigned_int[],_void_(*)(void_*)_noexcept> *in_RDX;
  ReturnCode in_ESI;
  FormatDescriptor *in_RDI;
  VkFormat unaff_retaddr;
  uint32_t *in_stack_00000018;
  unique_ptr<unsigned_int[],_void_(*)(void_*)_noexcept> dfd;
  uint *in_stack_ffffffffffffff78;
  unique_ptr<unsigned_int[],_void_(*)(void_*)_noexcept> *in_stack_ffffffffffffff80;
  FormatDescriptor *this;
  string local_50 [32];
  code *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  unique_ptr<unsigned_int[],_void_(*)(void_*)_noexcept> *args;
  FormatDescriptor *this_00;
  
  this = in_RDI;
  this_00 = in_RDI;
  vk2dfd(in_ESI);
  local_30 = free;
  std::unique_ptr<unsigned_int[],void(*)(void*)noexcept>::
  unique_ptr<unsigned_int*,void(*)(void*)noexcept,void>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)_noexcept>::value,_void_(*&&)(void_*)_noexcept>
              )0x1e81dc);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<unsigned_int[],_void_(*)(void_*)_noexcept> *)0x1e81e6);
  if (!bVar1) {
    args = in_RDX;
    toString_abi_cxx11_(unaff_retaddr);
    Reporter::fatal<char_const(&)[43],std::__cxx11::string>
              ((Reporter *)this_00,in_ESI,(char (*) [43])args,in_stack_ffffffffffffffe0);
    std::__cxx11::string::~string(local_50);
    in_stack_ffffffffffffff80 = in_RDX;
  }
  std::unique_ptr<unsigned_int[],_void_(*)(void_*)_noexcept>::get(in_stack_ffffffffffffff80);
  createFormatDescriptor(in_stack_00000018);
  std::unique_ptr<unsigned_int[],_void_(*)(void_*)_noexcept>::~unique_ptr
            ((unique_ptr<unsigned_int[],_void_(*)(void_*)_noexcept> *)this);
  return in_RDI;
}

Assistant:

[[nodiscard]] inline FormatDescriptor createFormatDescriptor(VkFormat vkFormat, Reporter& report) {
    const auto dfd = std::unique_ptr<uint32_t[], decltype(std::free)*>(vk2dfd(vkFormat), std::free);
    if (!dfd)
        report.fatal(rc::DFD_FAILURE, "Failed to create format descriptor for: {}", toString(vkFormat));

    return createFormatDescriptor(dfd.get());
}